

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImVector<unsigned_int> *this_00;
  ImDrawList *pIVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  uint *puVar4;
  ImDrawVert *pIVar5;
  ImDrawVert *pIVar6;
  long lVar7;
  int j;
  int iVar8;
  ImVector<ImDrawVert> local_58;
  ImDrawData *local_40;
  long local_38;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  local_40 = this;
  for (lVar7 = 0; lVar7 < this->CmdListsCount; lVar7 = lVar7 + 1) {
    pIVar1 = this->CmdLists[lVar7];
    iVar8 = (pIVar1->IdxBuffer).Size;
    if (iVar8 != 0) {
      local_38 = lVar7;
      ImVector<ImDrawVert>::resize(&local_58,iVar8);
      this_00 = &pIVar1->IdxBuffer;
      for (iVar8 = 0; iVar8 < this_00->Size; iVar8 = iVar8 + 1) {
        puVar4 = ImVector<unsigned_int>::operator[](this_00,iVar8);
        pIVar5 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,*puVar4);
        pIVar6 = ImVector<ImDrawVert>::operator[](&local_58,iVar8);
        IVar3 = pIVar5->uv;
        pIVar6->pos = pIVar5->pos;
        pIVar6->uv = IVar3;
        pIVar6->col = pIVar5->col;
      }
      uVar2._0_4_ = (pIVar1->VtxBuffer).Size;
      uVar2._4_4_ = (pIVar1->VtxBuffer).Capacity;
      (pIVar1->VtxBuffer).Size = local_58.Size;
      (pIVar1->VtxBuffer).Capacity = local_58.Capacity;
      pIVar5 = (pIVar1->VtxBuffer).Data;
      (pIVar1->VtxBuffer).Data = local_58.Data;
      local_58._0_8_ = uVar2;
      local_58.Data = pIVar5;
      ImVector<unsigned_int>::resize(this_00,0);
      local_40->TotalVtxCount = local_40->TotalVtxCount + (pIVar1->VtxBuffer).Size;
      lVar7 = local_38;
      this = local_40;
    }
  }
  ImVector<ImDrawVert>::~ImVector(&local_58);
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}